

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O3

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseStringToStream<0u,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericStringStream<rapidjson::UTF8<char>_> *is,StackStream<char> *os)

{
  Ch *pCVar1;
  uint codepoint;
  uint uVar2;
  byte *pbVar3;
  char *pcVar4;
  byte bVar5;
  size_t escapeOffset;
  
LAB_00109d50:
  do {
    pbVar3 = (byte *)is->src_;
    bVar5 = *pbVar3;
    if (bVar5 == 0x5c) {
      escapeOffset = (long)pbVar3 - (long)is->head_;
      is->src_ = (Ch *)(pbVar3 + 1);
      bVar5 = ""[pbVar3[1]];
      if (bVar5 == 0) {
        if (pbVar3[1] != 0x75) {
          ParseStringToStream<0u,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>>
                    ();
          return;
        }
        is->src_ = (Ch *)(pbVar3 + 2);
        codepoint = ParseHex4<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                              (this,is,escapeOffset);
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        if ((codepoint & 0xfffff800) == 0xd800) {
          if (((0xdbff < codepoint) || (pcVar4 = is->src_, *pcVar4 != '\\')) ||
             (is->src_ = pcVar4 + 1, pcVar4[1] != 'u')) {
LAB_00109f05:
            *(undefined4 *)(this + 0x30) = 9;
            *(size_t *)(this + 0x38) = escapeOffset;
            return;
          }
          is->src_ = pcVar4 + 2;
          uVar2 = ParseHex4<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                            (this,is,escapeOffset);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          if (uVar2 - 0xe000 < 0xfffffc00) goto LAB_00109f05;
          codepoint = codepoint * 0x400 + uVar2 + 0xfca02400;
        }
        UTF8<char>::
        Encode<rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>>
                  (os,codepoint);
        goto LAB_00109d50;
      }
      is->src_ = (Ch *)(pbVar3 + 2);
    }
    else {
      if (bVar5 == 0x22) {
        is->src_ = (Ch *)(pbVar3 + 1);
        pcVar4 = internal::Stack<rapidjson::CrtAllocator>::Push<char>(os->stack_,1);
        *pcVar4 = '\0';
        os->length_ = os->length_ + 1;
        return;
      }
      if (bVar5 < 0x20) {
        if (bVar5 == 0) {
          if (*(int *)(this + 0x30) != 0) {
            __assert_fail("!HasParseError()",
                          "/workspace/llm4binary/github/license_c_cmakelists/matusso[P]libssllabs/src/../include/rapidjson/include/rapidjson/reader.h"
                          ,0x420,
                          "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseStringToStream(InputStream &, OutputStream &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, SEncoding = rapidjson::UTF8<>, TEncoding = rapidjson::UTF8<>, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, OutputStream = rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::StackStream<char>]"
                         );
          }
          pCVar1 = is->head_;
          *(undefined4 *)(this + 0x30) = 0xb;
        }
        else {
          if (*(int *)(this + 0x30) != 0) {
            __assert_fail("!HasParseError()",
                          "/workspace/llm4binary/github/license_c_cmakelists/matusso[P]libssllabs/src/../include/rapidjson/include/rapidjson/reader.h"
                          ,0x422,
                          "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseStringToStream(InputStream &, OutputStream &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, SEncoding = rapidjson::UTF8<>, TEncoding = rapidjson::UTF8<>, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, OutputStream = rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::StackStream<char>]"
                         );
          }
          pCVar1 = is->head_;
          *(undefined4 *)(this + 0x30) = 0xc;
        }
        *(long *)(this + 0x38) = (long)pbVar3 - (long)pCVar1;
        return;
      }
      is->src_ = (Ch *)(pbVar3 + 1);
      bVar5 = *pbVar3;
    }
    pbVar3 = (byte *)internal::Stack<rapidjson::CrtAllocator>::Push<char>(os->stack_,1);
    *pbVar3 = bVar5;
    os->length_ = os->length_ + 1;
  } while( true );
}

Assistant:

RAPIDJSON_FORCEINLINE void ParseStringToStream(InputStream& is, OutputStream& os) {
//!@cond RAPIDJSON_HIDDEN_FROM_DOXYGEN
#define Z16 0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0
        static const char escape[256] = {
            Z16, Z16, 0, 0,'\"', 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, '/',
            Z16, Z16, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,'\\', 0, 0, 0,
            0, 0,'\b', 0, 0, 0,'\f', 0, 0, 0, 0, 0, 0, 0,'\n', 0,
            0, 0,'\r', 0,'\t', 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
            Z16, Z16, Z16, Z16, Z16, Z16, Z16, Z16
        };
#undef Z16
//!@endcond

        for (;;) {
            // Scan and copy string before "\\\"" or < 0x20. This is an optional optimzation.
            if (!(parseFlags & kParseValidateEncodingFlag))
                ScanCopyUnescapedString(is, os);

            Ch c = is.Peek();
            if (RAPIDJSON_UNLIKELY(c == '\\')) {    // Escape
                size_t escapeOffset = is.Tell();    // For invalid escaping, report the initial '\\' as error offset
                is.Take();
                Ch e = is.Peek();
                if ((sizeof(Ch) == 1 || unsigned(e) < 256) && RAPIDJSON_LIKELY(escape[static_cast<unsigned char>(e)])) {
                    is.Take();
                    os.Put(static_cast<typename TEncoding::Ch>(escape[static_cast<unsigned char>(e)]));
                }
                else if ((parseFlags & kParseEscapedApostropheFlag) && RAPIDJSON_LIKELY(e == '\'')) { // Allow escaped apostrophe
                    is.Take();
                    os.Put('\'');
                }
                else if (RAPIDJSON_LIKELY(e == 'u')) {    // Unicode
                    is.Take();
                    unsigned codepoint = ParseHex4(is, escapeOffset);
                    RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
                    if (RAPIDJSON_UNLIKELY(codepoint >= 0xD800 && codepoint <= 0xDFFF)) {
                        // high surrogate, check if followed by valid low surrogate
                        if (RAPIDJSON_LIKELY(codepoint <= 0xDBFF)) {
                            // Handle UTF-16 surrogate pair
                            if (RAPIDJSON_UNLIKELY(!Consume(is, '\\') || !Consume(is, 'u')))
                                RAPIDJSON_PARSE_ERROR(kParseErrorStringUnicodeSurrogateInvalid, escapeOffset);
                            unsigned codepoint2 = ParseHex4(is, escapeOffset);
                            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
                            if (RAPIDJSON_UNLIKELY(codepoint2 < 0xDC00 || codepoint2 > 0xDFFF))
                                RAPIDJSON_PARSE_ERROR(kParseErrorStringUnicodeSurrogateInvalid, escapeOffset);
                            codepoint = (((codepoint - 0xD800) << 10) | (codepoint2 - 0xDC00)) + 0x10000;
                        }
                        // single low surrogate
                        else
                        {
                            RAPIDJSON_PARSE_ERROR(kParseErrorStringUnicodeSurrogateInvalid, escapeOffset);
                        }
                    }
                    TEncoding::Encode(os, codepoint);
                }
                else
                    RAPIDJSON_PARSE_ERROR(kParseErrorStringEscapeInvalid, escapeOffset);
            }
            else if (RAPIDJSON_UNLIKELY(c == '"')) {    // Closing double quote
                is.Take();
                os.Put('\0');   // null-terminate the string
                return;
            }
            else if (RAPIDJSON_UNLIKELY(static_cast<unsigned>(c) < 0x20)) { // RFC 4627: unescaped = %x20-21 / %x23-5B / %x5D-10FFFF
                if (c == '\0')
                    RAPIDJSON_PARSE_ERROR(kParseErrorStringMissQuotationMark, is.Tell());
                else
                    RAPIDJSON_PARSE_ERROR(kParseErrorStringInvalidEncoding, is.Tell());
            }
            else {
                size_t offset = is.Tell();
                if (RAPIDJSON_UNLIKELY((parseFlags & kParseValidateEncodingFlag ?
                    !Transcoder<SEncoding, TEncoding>::Validate(is, os) :
                    !Transcoder<SEncoding, TEncoding>::Transcode(is, os))))
                    RAPIDJSON_PARSE_ERROR(kParseErrorStringInvalidEncoding, offset);
            }
        }
    }